

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeNF
          (ChElementShellANCF_3423 *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double *pdVar18;
  long lVar19;
  Product<Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
  *src;
  long lVar20;
  Index i;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  VectorN G_C;
  ShapeVector Nz;
  ShapeVector Ny;
  ShapeVector Nx;
  ShapeVector N;
  Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_> QiCompact;
  ChMatrix33<double> J_Cxi;
  VectorN G_B;
  VectorN G_A;
  ChMatrix33<double> J_Cxi_Inv;
  MatrixNx3 Sxi_D;
  MatrixNx3 e_bar;
  double local_4c0 [4];
  double local_4a0;
  double local_498;
  double local_490;
  double local_488;
  double local_480 [8];
  double local_440 [8];
  double local_400 [8];
  Matrix<double,_1,_8,_1,_1,_8> local_3c0;
  double *local_358 [2];
  Matrix<double,_3,_3,_1,_3,_3> local_348;
  double local_300 [4];
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  SrcXprType local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  Matrix<double,_3,_3,_1,_3,_3> local_248;
  Matrix<double,_8,_3,_1,_8,_3> local_200;
  assign_op<double,_double> local_140 [272];
  
  dVar16 = 1.0 - U;
  dVar5 = dVar16 * 0.25;
  dVar35 = 1.0 - V;
  dVar6 = dVar35 * dVar5;
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5] =
       this->m_thickness * 0.0 * 0.5 * 0.25;
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7] =
       dVar16 * local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                m_data.array[5];
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[1] =
       dVar35 * local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                m_data.array[7];
  dVar3 = U + 1.0;
  dVar7 = dVar3 * 0.25;
  dVar8 = dVar35 * dVar7;
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5] =
       dVar3 * local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[5];
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[3] =
       dVar35 * local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                m_data.array[5];
  dVar4 = V + 1.0;
  dVar9 = dVar7 * dVar4;
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[5] =
       dVar4 * local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[5];
  dVar10 = dVar5 * dVar4;
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[7] =
       dVar4 * local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
               m_data.array[7];
  local_358[0] = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
  dVar2 = (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows;
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[0] =
       dVar6;
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[2] =
       dVar8;
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[4] =
       dVar9;
  local_3c0.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array[6] =
       dVar10;
  if (2 < (long)dVar2) {
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[1]
         = (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[0]
         = (double)&local_3c0;
    src = (Product<Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
           *)&local_200;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[2]
         = 1.48219693752374e-323;
    lVar21 = 0;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[5]
         = 0.0;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[4]
         = (double)F;
    local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.array[7]
         = dVar2;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,8,3,1,8,3>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>,Eigen::internal::assign_op<double,double>>
              ((Map<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_0,_Eigen::Stride<0,_0>_> *)local_358,src,
               local_140,(type)0x0);
    dVar2 = this->m_lenX;
    dVar1 = this->m_thickness;
    dVar11 = (-2.0 / dVar2) * 0.25;
    local_400[0] = dVar35 * dVar11;
    dVar12 = dVar1 * 0.0 * 0.5 * 0.25;
    dVar13 = (-2.0 / dVar2) * dVar12;
    local_400[1] = dVar35 * dVar13;
    dVar14 = (2.0 / dVar2) * 0.25;
    local_400[2] = dVar35 * dVar14;
    dVar15 = (2.0 / dVar2) * dVar12;
    local_400[3] = dVar35 * dVar15;
    local_400[4] = dVar4 * dVar14;
    local_400[5] = dVar4 * dVar15;
    local_400[6] = dVar4 * dVar11;
    local_400[7] = dVar4 * dVar13;
    dVar4 = this->m_lenY;
    dVar35 = -2.0 / dVar4;
    local_440[0] = dVar5 * dVar35;
    local_440[1] = dVar12 * dVar16 * dVar35;
    local_440[2] = dVar7 * dVar35;
    local_440[3] = dVar12 * dVar3 * dVar35;
    dVar35 = 2.0 / dVar4;
    local_440[4] = dVar7 * dVar35;
    local_440[5] = dVar12 * dVar3 * dVar35;
    local_440[6] = dVar5 * dVar35;
    local_440[7] = dVar12 * dVar16 * dVar35;
    local_480[0] = 0.0;
    local_480[1] = dVar6;
    local_480[2] = 0.0;
    local_480[3] = dVar8;
    local_480[4] = 0.0;
    local_480[5] = dVar9;
    local_480[6] = 0.0;
    local_480[7] = dVar10;
    do {
      (src->m_lhs).m_matrix = (non_const_type)(dVar2 * local_400[lVar21] * 0.5);
      lVar21 = lVar21 + 1;
      src = (Product<Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
             *)&(src->m_rhs).m_matrix.
                super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                .field_0x10;
    } while (lVar21 != 8);
    pdVar18 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 1;
    lVar21 = 0;
    do {
      *pdVar18 = dVar4 * local_440[lVar21] * 0.5;
      lVar21 = lVar21 + 1;
      pdVar18 = pdVar18 + 3;
    } while (lVar21 != 8);
    pdVar18 = local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 2;
    lVar21 = 0;
    do {
      *pdVar18 = dVar1 * local_480[lVar21] * 0.5;
      lVar21 = lVar21 + 1;
      pdVar18 = pdVar18 + 3;
    } while (lVar21 != 8);
    CalcCoordMatrix(this,(ChMatrixNM<double,_8,_3> *)local_140);
    local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
         = (double)&local_200;
    local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = (double)local_140;
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Matrix<double,8,3,1,8,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>
              (&local_348,(Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_> *)&local_248,
               (Matrix<double,_8,_3,_1,_8,_3> *)
               local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[1]);
    local_2c0.m_xpr = &local_348;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_248,&local_2c0,(assign_op<double,_double> *)local_300);
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0];
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[1];
    auVar69._8_8_ = 0;
    auVar69._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22 = vmulsd_avx512f(auVar69,auVar25);
    auVar74._8_8_ = 0;
    auVar74._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar23 = vmulsd_avx512f(auVar74,auVar29);
    auVar33._8_8_ = 0;
    auVar33._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[2];
    auVar79._8_8_ = 0;
    auVar79._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar24 = vmulsd_avx512f(auVar79,auVar33);
    local_2c0.m_xpr = (XprTypeNested)(auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_);
    auVar36._8_8_ = 0;
    auVar36._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[3];
    auVar22 = vmulsd_avx512f(auVar69,auVar36);
    auVar38._8_8_ = 0;
    auVar38._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[4];
    auVar23 = vmulsd_avx512f(auVar74,auVar38);
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[5];
    auVar24 = vmulsd_avx512f(auVar79,auVar40);
    local_2b8 = auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[6];
    auVar70._8_8_ = 0;
    auVar70._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22 = vmulsd_avx512f(auVar70,auVar42);
    auVar45._8_8_ = 0;
    auVar45._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[7];
    auVar75._8_8_ = 0;
    auVar75._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar23 = vmulsd_avx512f(auVar75,auVar45);
    auVar49._8_8_ = 0;
    auVar49._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[8];
    auVar80._8_8_ = 0;
    auVar80._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar24 = vmulsd_avx512f(auVar80,auVar49);
    local_2b0 = auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[9];
    auVar22 = vmulsd_avx512f(auVar70,auVar52);
    auVar53._8_8_ = 0;
    auVar53._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[10];
    auVar23 = vmulsd_avx512f(auVar75,auVar53);
    auVar54._8_8_ = 0;
    auVar54._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0xb];
    auVar24 = vmulsd_avx512f(auVar80,auVar54);
    local_2a8 = auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0xc];
    auVar56._8_8_ = 0;
    auVar56._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0xd];
    auVar22 = vmulsd_avx512f(auVar70,auVar55);
    auVar23 = vmulsd_avx512f(auVar75,auVar56);
    auVar57._8_8_ = 0;
    auVar57._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0xe];
    auVar24 = vmulsd_avx512f(auVar80,auVar57);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = auVar22._0_8_ + auVar23._0_8_;
    auVar22 = vaddsd_avx512f(auVar58,auVar24);
    local_2a0 = auVar22._0_8_;
    auVar59._8_8_ = 0;
    auVar59._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0xf];
    auVar22 = vmulsd_avx512f(auVar70,auVar59);
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x10];
    auVar23 = vmulsd_avx512f(auVar75,auVar24);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    auVar60._8_8_ = 0;
    auVar60._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x11];
    auVar23 = vmulsd_avx512f(auVar80,auVar60);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    vmovsd_avx512f(auVar22);
    auVar62._8_8_ = 0;
    auVar62._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x12];
    auVar71._8_8_ = 0;
    auVar71._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22 = vmulsd_avx512f(auVar71,auVar62);
    auVar63._8_8_ = 0;
    auVar63._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x13];
    auVar76._8_8_ = 0;
    auVar76._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar23 = vmulsd_avx512f(auVar76,auVar63);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    auVar65._8_8_ = 0;
    auVar65._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x14];
    auVar81._8_8_ = 0;
    auVar81._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar23 = vmulsd_avx512f(auVar81,auVar65);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    vmovsd_avx512f(auVar22);
    auVar67._8_8_ = 0;
    auVar67._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x15];
    auVar22 = vmulsd_avx512f(auVar71,auVar67);
    auVar72._8_8_ = 0;
    auVar72._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x16];
    auVar23 = vmulsd_avx512f(auVar76,auVar72);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    auVar77._8_8_ = 0;
    auVar77._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x17];
    auVar23 = vmulsd_avx512f(auVar81,auVar77);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    vmovsd_avx512f(auVar22);
    auVar97._8_8_ = 0;
    auVar97._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar22 = vmulsd_avx512f(auVar25,auVar97);
    auVar85._8_8_ = 0;
    auVar85._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar23 = vmulsd_avx512f(auVar29,auVar85);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    auVar91._8_8_ = 0;
    auVar91._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar23 = vmulsd_avx512f(auVar33,auVar91);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    vmovsd_avx512f(auVar22);
    auVar22 = vmulsd_avx512f(auVar36,auVar97);
    auVar23 = vmulsd_avx512f(auVar38,auVar85);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    auVar23 = vmulsd_avx512f(auVar40,auVar91);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    vmovsd_avx512f(auVar22);
    auVar98._8_8_ = 0;
    auVar98._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar22 = vmulsd_avx512f(auVar42,auVar98);
    auVar86._8_8_ = 0;
    auVar86._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar23 = vmulsd_avx512f(auVar45,auVar86);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    auVar92._8_8_ = 0;
    auVar92._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar23 = vmulsd_avx512f(auVar49,auVar92);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    vmovsd_avx512f(auVar22);
    auVar22 = vmulsd_avx512f(auVar52,auVar98);
    auVar23 = vmulsd_avx512f(auVar53,auVar86);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    auVar23 = vmulsd_avx512f(auVar54,auVar92);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    vmovsd_avx512f(auVar22);
    auVar22 = vmulsd_avx512f(auVar55,auVar98);
    auVar23 = vmulsd_avx512f(auVar56,auVar86);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    auVar23 = vmulsd_avx512f(auVar57,auVar92);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    vmovsd_avx512f(auVar22);
    auVar22 = vmulsd_avx512f(auVar59,auVar98);
    auVar23 = vmulsd_avx512f(auVar24,auVar86);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    auVar23 = vmulsd_avx512f(auVar60,auVar92);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    vmovsd_avx512f(auVar22);
    auVar99._8_8_ = 0;
    auVar99._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar22 = vmulsd_avx512f(auVar62,auVar99);
    auVar87._8_8_ = 0;
    auVar87._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar23 = vmulsd_avx512f(auVar63,auVar87);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    auVar93._8_8_ = 0;
    auVar93._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar23 = vmulsd_avx512f(auVar65,auVar93);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    vmovsd_avx512f(auVar22);
    auVar22 = vmulsd_avx512f(auVar67,auVar99);
    auVar23 = vmulsd_avx512f(auVar72,auVar87);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    auVar23 = vmulsd_avx512f(auVar77,auVar93);
    auVar22 = vaddsd_avx512f(auVar22,auVar23);
    vmovsd_avx512f(auVar22);
    auVar82._8_8_ = 0;
    auVar82._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar22 = vmulsd_avx512f(auVar25,auVar82);
    auVar88._8_8_ = 0;
    auVar88._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar23 = vmulsd_avx512f(auVar29,auVar88);
    auVar94._8_8_ = 0;
    auVar94._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar24 = vmulsd_avx512f(auVar33,auVar94);
    local_4c0[0] = auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_;
    auVar22 = vmulsd_avx512f(auVar36,auVar82);
    auVar23 = vmulsd_avx512f(auVar38,auVar88);
    auVar24 = vmulsd_avx512f(auVar40,auVar94);
    local_4c0[1] = auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_;
    auVar83._8_8_ = 0;
    auVar83._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar22 = vmulsd_avx512f(auVar42,auVar83);
    auVar89._8_8_ = 0;
    auVar89._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar23 = vmulsd_avx512f(auVar45,auVar89);
    auVar95._8_8_ = 0;
    auVar95._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar24 = vmulsd_avx512f(auVar49,auVar95);
    local_4c0[2] = auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_;
    auVar22 = vmulsd_avx512f(auVar52,auVar83);
    auVar23 = vmulsd_avx512f(auVar53,auVar89);
    auVar24 = vmulsd_avx512f(auVar54,auVar95);
    local_4c0[3] = auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_;
    auVar22 = vmulsd_avx512f(auVar55,auVar83);
    auVar23 = vmulsd_avx512f(auVar56,auVar89);
    auVar24 = vmulsd_avx512f(auVar57,auVar95);
    local_4a0 = auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_;
    auVar22 = vmulsd_avx512f(auVar59,auVar83);
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x10];
    auVar23 = vmulsd_avx512f(auVar23,auVar89);
    auVar61._8_8_ = 0;
    auVar61._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x11];
    auVar24 = vmulsd_avx512f(auVar61,auVar95);
    local_498 = auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x12];
    auVar84._8_8_ = 0;
    auVar84._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar22 = vmulsd_avx512f(auVar22,auVar84);
    auVar64._8_8_ = 0;
    auVar64._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x13];
    auVar90._8_8_ = 0;
    auVar90._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar23 = vmulsd_avx512f(auVar64,auVar90);
    auVar66._8_8_ = 0;
    auVar66._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x14];
    auVar96._8_8_ = 0;
    auVar96._0_8_ =
         local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar24 = vmulsd_avx512f(auVar66,auVar96);
    local_490 = auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_;
    auVar68._8_8_ = 0;
    auVar68._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x15];
    auVar22 = vmulsd_avx512f(auVar68,auVar84);
    auVar73._8_8_ = 0;
    auVar73._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x16];
    auVar23 = vmulsd_avx512f(auVar73,auVar90);
    auVar78._8_8_ = 0;
    auVar78._0_8_ =
         local_200.super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data.
         array[0x17];
    auVar24 = vmulsd_avx512f(auVar78,auVar96);
    local_488 = auVar22._0_8_ + auVar23._0_8_ + auVar24._0_8_;
    if (5 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar18 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar17._8_8_ = 0x3fe0000000000000;
      auVar17._0_8_ = 0x3fe0000000000000;
      auVar23 = vmulpd_avx512vl(*(undefined1 (*) [16])(pdVar18 + 3),auVar17);
      dVar2 = pdVar18[5] * 0.5;
      auVar22 = vshufpd_avx(auVar23,auVar23,1);
      pdVar18 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      lVar21 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      lVar19 = 2;
      lVar20 = 0;
      while (lVar19 + -2 < lVar21) {
        dVar3 = *(double *)((long)local_4c0 + lVar20);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = dVar3;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(double *)((long)local_300 + lVar20);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(double *)((long)local_300 + lVar20) * -dVar2;
        auVar24 = vfmadd231sd_fma(auVar50,auVar22,auVar46);
        pdVar18[lVar19 + -2] = auVar24._0_8_ + pdVar18[lVar19 + -2];
        if (lVar21 <= lVar19 + -1) break;
        dVar4 = *(double *)((long)&local_2c0.m_xpr + lVar20);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = dVar4;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar2;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = dVar3 * -auVar23._0_8_;
        auVar24 = vfmadd231sd_fma(auVar47,auVar30,auVar51);
        pdVar18[lVar19 + -1] = auVar24._0_8_ + pdVar18[lVar19 + -1];
        if (lVar21 <= lVar19) break;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = dVar4 * -auVar22._0_8_;
        auVar24 = vfmadd213sd_fma(auVar43,auVar23,auVar48);
        pdVar18[lVar19] = auVar24._0_8_ + pdVar18[lVar19];
        lVar19 = lVar19 + 3;
        lVar20 = lVar20 + 8;
        if (lVar19 == 0x1a) {
          auVar26._8_8_ = 0;
          auVar26._0_8_ =
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[3];
          auVar31._8_8_ = 0;
          auVar31._0_8_ =
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[7];
          auVar34._8_8_ = 0;
          auVar34._0_8_ =
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[6];
          auVar37._8_8_ = 0;
          auVar37._0_8_ =
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[4];
          auVar39._8_8_ = 0;
          auVar39._0_8_ =
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[4] *
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[6];
          auVar22 = vfmsub231sd_fma(auVar39,auVar26,auVar31);
          auVar41._8_8_ = 0;
          auVar41._0_8_ =
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[0];
          auVar44._8_8_ = 0;
          auVar44._0_8_ =
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[1];
          auVar32._8_8_ = 0;
          auVar32._0_8_ =
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[7] *
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[0];
          auVar23 = vfmsub231sd_fma(auVar32,auVar44,auVar34);
          auVar22 = vunpcklpd_avx(auVar22,auVar23);
          auVar27._8_8_ = 0;
          auVar27._0_8_ =
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[1] *
               local_348.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
               m_data.array[3];
          auVar23 = vfmsub231sd_fma(auVar27,auVar41,auVar37);
          auVar28._8_8_ = 0;
          auVar28._0_8_ =
               auVar23._0_8_ * auVar23._0_8_ +
               auVar22._0_8_ * auVar22._0_8_ + auVar22._8_8_ * auVar22._8_8_;
          auVar22 = vsqrtsd_avx(auVar28,auVar28);
          *detJ = auVar22._0_8_;
          return;
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementShellANCF_3423::ComputeNF(
    const double U,              // parametric coordinate in surface
    const double V,              // parametric coordinate in surface
    ChVectorDynamic<>& Qi,       // Return result of Q = N'*F  here
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is =n. field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    ShapeVector N;
    ShapeFunctions(N, U, V, 0);

    Eigen::Map<MatrixNx3> QiCompact(Qi.data(), NSF, 3);
    QiCompact = N.transpose() * F.segment(0, 3).transpose();

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeVector Nz;
    ShapeFunctionsDerivativeX(Nx, U, V, 0);
    ShapeFunctionsDerivativeY(Ny, U, V, 0);
    ShapeFunctionsDerivativeZ(Nz, U, V, 0);

    // Change the shape function derivatives with respect to the element local "x", "y", or "z" coordinates to be with
    // respect to the normalized coordinates "xi", "eta", and "zeta" when loading the results into the Sxi_D matrix
    MatrixNx3 Sxi_D;
    Sxi_D.col(0) = Nx * m_lenX / 2;
    Sxi_D.col(1) = Ny * m_lenY / 2;
    Sxi_D.col(2) = Nz * m_thickness / 2;

    MatrixNx3 e_bar;
    CalcCoordMatrix(e_bar);

    // Calculate the element Jacobian between the current configuration and the normalized configuration
    ChMatrix33<double> J_Cxi = e_bar.transpose() * Sxi_D;
    ChMatrix33<double> J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i + 0) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi(3 * i + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi(3 * i + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential area and the normalized differential area.  The cross product is
    //  used to calculate this area ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.col(0).cross(J_Cxi.col(1)).norm();
}